

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigTest.cpp
# Opt level: O0

void __thiscall jaegertracing::Config_testFromEnv_Test::TestBody(Config_testFromEnv_Test *this)

{
  bool bVar1;
  Config *pCVar2;
  string *psVar3;
  char *pcVar4;
  duration *pdVar5;
  Config *pCVar6;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *rhs;
  AssertHelper local_9b8 [8];
  Message local_9b0 [15];
  allocator local_9a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_19;
  Message local_968 [14];
  bool local_95a;
  bool local_959;
  undefined1 local_958 [8];
  AssertionResult gtest_ar_18;
  Message local_940 [14];
  bool local_932;
  bool local_931;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_17;
  Message local_918 [8];
  undefined1 local_910 [8];
  AssertionResult gtest_ar_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  allocator local_8d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  allocator local_8a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  allocator local_881;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  undefined1 local_860 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> expectedTags;
  Message local_840 [15];
  allocator local_831;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_15;
  Message local_7f8 [15];
  allocator local_7e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar_14;
  Message local_7b0 [8];
  double local_7a8;
  double local_7a0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_13;
  Message local_780 [15];
  allocator local_771;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_12;
  Message local_738 [14];
  bool local_72a;
  bool local_729;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_11;
  Message local_710 [12];
  int local_704;
  duration<long,_std::ratio<1L,_1000L>_> local_700;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_10;
  Message local_6e0 [8];
  int local_6d8 [2];
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_9;
  Message local_6b8 [15];
  allocator local_6a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_8;
  Message local_670 [15];
  allocator local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_7;
  Message local_628 [15];
  allocator local_619;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_6;
  Message local_5e0 [8];
  double local_5d8;
  double local_5d0;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_5;
  Message local_5b0 [14];
  bool local_5a2;
  bool local_5a1;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_4;
  Message local_588 [12];
  int local_57c;
  duration<long,_std::ratio<1L,_1000L>_> local_578;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_3;
  Message local_558 [8];
  int local_550 [2];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_2;
  Message local_530 [15];
  allocator local_521;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4e8 [8];
  Message local_4e0 [15];
  allocator local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar;
  string local_498;
  duration local_478;
  allocator local_469;
  string local_468;
  RestrictionsConfig local_448;
  HeadersConfig local_418;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  int local_344;
  duration<long,_std::ratio<1L,_1000L>_> local_340;
  duration local_338;
  Config local_330;
  duration local_2d8;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  Config local_280;
  undefined1 local_228 [8];
  Config config;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  Config_testFromEnv_Test *this_local;
  
  tags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"foo",&local_49);
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[9],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)local_28,
             (char (*) [9])"hostname",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"1.2.3",
             (allocator *)((long)&config._baggageRestrictions._refreshInterval.__r + 7));
  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>::
  emplace_back<char_const(&)[15],std::__cxx11::string>
            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>> *)local_28,
             (char (*) [15])"my.app.version",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&config._baggageRestrictions._refreshInterval.__r + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"probabilistic",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"http://host34:57/sampling",&local_2c9);
  local_2d8.__r = 0;
  samplers::Config::Config(&local_280,&local_2a0,0.7,&local_2c8,0,&local_2d8);
  local_344 = 100;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_340,&local_344);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_338,&local_340);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"host35:77",&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"http://host36:56568",&local_391);
  reporters::Config::Config(&local_330,10,&local_338,false,&local_368,&local_390);
  propagation::HeadersConfig::HeadersConfig(&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"",&local_469);
  local_478.__r = 0;
  baggage::RestrictionsConfig::RestrictionsConfig(&local_448,false,&local_468,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_498,"test-service",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  Config::Config((Config *)local_228,false,&local_280,&local_330,&local_418,&local_448,&local_498,
                 (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_28);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  baggage::RestrictionsConfig::~RestrictionsConfig(&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  propagation::HeadersConfig::~HeadersConfig(&local_418);
  reporters::Config::~Config(&local_330);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  samplers::Config::~Config(&local_280);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  jaegertracing::Config::fromEnv();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"http://host36:56568",&local_4d1);
  pCVar2 = Config::reporter((Config *)local_228);
  psVar3 = reporters::Config::endpoint_abi_cxx11_(pCVar2);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4b0,"std::string(\"http://host36:56568\")",
             "config.reporter().endpoint()",&local_4d0,psVar3);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(local_4e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              (local_4e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
               ,0x7b,pcVar4);
    testing::internal::AssertHelper::operator=(local_4e8,local_4e0);
    testing::internal::AssertHelper::~AssertHelper(local_4e8);
    testing::Message::~Message(local_4e0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_520,"host35:77",&local_521);
    pCVar2 = Config::reporter((Config *)local_228);
    psVar3 = reporters::Config::localAgentHostPort_abi_cxx11_(pCVar2);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_500,"std::string(\"host35:77\")",
               "config.reporter().localAgentHostPort()",&local_520,psVar3);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar1) {
      testing::Message::Message(local_530);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                 ,0x7c,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_530);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_530);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_550[1] = 10;
      pCVar2 = Config::reporter((Config *)local_228);
      local_550[0] = reporters::Config::queueSize(pCVar2);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_548,"10","config.reporter().queueSize()",local_550 + 1,
                 local_550);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
      if (!bVar1) {
        testing::Message::Message(local_558);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                   ,0x7e,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_558);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_558);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_57c = 100;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_578,&local_57c);
        pCVar2 = Config::reporter((Config *)local_228);
        pdVar5 = reporters::Config::bufferFlushInterval(pCVar2);
        testing::internal::EqHelper<false>::
        Compare<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  ((EqHelper<false> *)local_570,"std::chrono::milliseconds(100)",
                   "config.reporter().bufferFlushInterval()",&local_578,pdVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
        if (!bVar1) {
          testing::Message::Message(local_588);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                     ,0x80,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_588)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(local_588);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_5a1 = false;
          pCVar2 = Config::reporter((Config *)local_228);
          local_5a2 = reporters::Config::logSpans(pCVar2);
          testing::internal::EqHelper<false>::Compare<bool,bool>
                    ((EqHelper<false> *)local_5a0,"false","config.reporter().logSpans()",&local_5a1,
                     &local_5a2);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
          if (!bVar1) {
            testing::Message::Message(local_5b0);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                       ,0x81,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,local_5b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(local_5b0);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            local_5d0 = 0.7;
            pCVar6 = Config::sampler((Config *)local_228);
            local_5d8 = samplers::Config::param(pCVar6);
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((EqHelper<false> *)local_5c8,".7","config.sampler().param()",&local_5d0,
                       &local_5d8);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
            if (!bVar1) {
              testing::Message::Message(local_5e0);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                         ,0x83,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,local_5e0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(local_5e0);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_618,"probabilistic",&local_619);
              pCVar6 = Config::sampler((Config *)local_228);
              psVar3 = samplers::Config::type_abi_cxx11_(pCVar6);
              testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                        ((EqHelper<false> *)local_5f8,"std::string(\"probabilistic\")",
                         "config.sampler().type()",&local_618,psVar3);
              std::__cxx11::string::~string((string *)&local_618);
              std::allocator<char>::~allocator((allocator<char> *)&local_619);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
              if (!bVar1) {
                testing::Message::Message(local_628);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                           ,0x84,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,local_628);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(local_628);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST","host33");
                testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT","45");
                testutils::EnvVariable::setEnv("JAEGER_ENDPOINT","http://host34:56567");
                testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE","33");
                testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL","45");
                testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS","true");
                testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE","remote");
                testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM","0.33");
                testutils::EnvVariable::setEnv("JAEGER_SAMPLING_ENDPOINT","http://myagent:1234");
                testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME","AService");
                testutils::EnvVariable::setEnv("JAEGER_TAGS","hostname=foobar,my.app.version=4.5.6")
                ;
                jaegertracing::Config::fromEnv();
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_660,"http://host34:56567",&local_661);
                pCVar2 = Config::reporter((Config *)local_228);
                psVar3 = reporters::Config::endpoint_abi_cxx11_(pCVar2);
                testing::internal::EqHelper<false>::
                Compare<std::__cxx11::string,std::__cxx11::string>
                          ((EqHelper<false> *)local_640,"std::string(\"http://host34:56567\")",
                           "config.reporter().endpoint()",&local_660,psVar3);
                std::__cxx11::string::~string((string *)&local_660);
                std::allocator<char>::~allocator((allocator<char> *)&local_661);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_640);
                if (!bVar1) {
                  testing::Message::Message(local_670);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                             ,0x97,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,local_670);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(local_670);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_6a8,"host33:45",&local_6a9);
                  pCVar2 = Config::reporter((Config *)local_228);
                  psVar3 = reporters::Config::localAgentHostPort_abi_cxx11_(pCVar2);
                  testing::internal::EqHelper<false>::
                  Compare<std::__cxx11::string,std::__cxx11::string>
                            ((EqHelper<false> *)local_688,"std::string(\"host33:45\")",
                             "config.reporter().localAgentHostPort()",&local_6a8,psVar3);
                  std::__cxx11::string::~string((string *)&local_6a8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_688);
                  if (!bVar1) {
                    testing::Message::Message(local_6b8);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_688)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                               ,0x98,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,local_6b8);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(local_6b8);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    local_6d8[1] = 0x21;
                    pCVar2 = Config::reporter((Config *)local_228);
                    local_6d8[0] = reporters::Config::queueSize(pCVar2);
                    testing::internal::EqHelper<false>::Compare<int,int>
                              ((EqHelper<false> *)local_6d0,"33","config.reporter().queueSize()",
                               local_6d8 + 1,local_6d8);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_6d0);
                    if (!bVar1) {
                      testing::Message::Message(local_6e0);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_6d0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                 ,0x9a,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,local_6e0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(local_6e0);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                      local_704 = 0x2d;
                      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                                ((duration<long,std::ratio<1l,1000l>> *)&local_700,&local_704);
                      pCVar2 = Config::reporter((Config *)local_228);
                      pdVar5 = reporters::Config::bufferFlushInterval(pCVar2);
                      testing::internal::EqHelper<false>::
                      Compare<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                ((EqHelper<false> *)local_6f8,"std::chrono::milliseconds(45)",
                                 "config.reporter().bufferFlushInterval()",&local_700,pdVar5);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_6f8);
                      if (!bVar1) {
                        testing::Message::Message(local_710);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_6f8);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                   ,0x9c,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,local_710);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(local_710);
                      }
                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                        local_729 = true;
                        pCVar2 = Config::reporter((Config *)local_228);
                        local_72a = reporters::Config::logSpans(pCVar2);
                        testing::internal::EqHelper<false>::Compare<bool,bool>
                                  ((EqHelper<false> *)local_728,"true",
                                   "config.reporter().logSpans()",&local_729,&local_72a);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_728);
                        if (!bVar1) {
                          testing::Message::Message(local_738);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_728);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                     ,0x9d,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,local_738);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(local_738);
                        }
                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string((string *)&local_770,"remote",&local_771);
                          pCVar6 = Config::sampler((Config *)local_228);
                          psVar3 = samplers::Config::type_abi_cxx11_(pCVar6);
                          testing::internal::EqHelper<false>::
                          Compare<std::__cxx11::string,std::__cxx11::string>
                                    ((EqHelper<false> *)local_750,"std::string(\"remote\")",
                                     "config.sampler().type()",&local_770,psVar3);
                          std::__cxx11::string::~string((string *)&local_770);
                          std::allocator<char>::~allocator((allocator<char> *)&local_771);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_750);
                          if (!bVar1) {
                            testing::Message::Message(local_780);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_750);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                       ,0x9f,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,local_780);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(local_780);
                          }
                          gtest_ar_1.message_.ptr_._5_3_ = 0;
                          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
                          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                            local_7a0 = 0.33;
                            pCVar6 = Config::sampler((Config *)local_228);
                            local_7a8 = samplers::Config::param(pCVar6);
                            testing::internal::EqHelper<false>::Compare<double,double>
                                      ((EqHelper<false> *)local_798,"0.33",
                                       "config.sampler().param()",&local_7a0,&local_7a8);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_798);
                            if (!bVar1) {
                              testing::Message::Message(local_7b0);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_798);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                         ,0xa0,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,local_7b0);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(local_7b0);
                            }
                            gtest_ar_1.message_.ptr_._5_3_ = 0;
                            gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_798)
                            ;
                            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)&local_7e8,"http://myagent:1234",&local_7e9);
                              pCVar6 = Config::sampler((Config *)local_228);
                              psVar3 = samplers::Config::samplingServerURL_abi_cxx11_(pCVar6);
                              testing::internal::EqHelper<false>::
                              Compare<std::__cxx11::string,std::__cxx11::string>
                                        ((EqHelper<false> *)local_7c8,
                                         "std::string(\"http://myagent:1234\")",
                                         "config.sampler().samplingServerURL()",&local_7e8,psVar3);
                              std::__cxx11::string::~string((string *)&local_7e8);
                              std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_7c8);
                              if (!bVar1) {
                                testing::Message::Message(local_7f8);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_7c8);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                           ,0xa1,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,local_7f8);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(local_7f8);
                              }
                              gtest_ar_1.message_.ptr_._5_3_ = 0;
                              gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_7c8);
                              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)&local_830,"AService",&local_831);
                                psVar3 = Config::serviceName_abi_cxx11_((Config *)local_228);
                                testing::internal::EqHelper<false>::
                                Compare<std::__cxx11::string,std::__cxx11::string>
                                          ((EqHelper<false> *)local_810,"std::string(\"AService\")",
                                           "config.serviceName()",&local_830,psVar3);
                                std::__cxx11::string::~string((string *)&local_830);
                                std::allocator<char>::~allocator((allocator<char> *)&local_831);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_810);
                                if (!bVar1) {
                                  testing::Message::Message(local_840);
                                  pcVar4 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_810);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)
                                             &expectedTags.
                                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                             ,0xa3,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)
                                             &expectedTags.
                                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                             local_840);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)
                                             &expectedTags.
                                              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                                  testing::Message::~Message(local_840);
                                }
                                gtest_ar_1.message_.ptr_._5_3_ = 0;
                                gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_810);
                                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                  std::
                                  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
                                  vector((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                          *)local_860);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_880,"foo",&local_881);
                                  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                  ::emplace_back<char_const(&)[9],std::__cxx11::string>
                                            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                              *)local_860,(char (*) [9])"hostname",&local_880);
                                  std::__cxx11::string::~string((string *)&local_880);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_881);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_8a8,"1.2.3",&local_8a9);
                                  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                  ::emplace_back<char_const(&)[15],std::__cxx11::string>
                                            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                              *)local_860,(char (*) [15])"my.app.version",&local_8a8
                                            );
                                  std::__cxx11::string::~string((string *)&local_8a8);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_8d0,"foobar",&local_8d1);
                                  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                  ::emplace_back<char_const(&)[9],std::__cxx11::string>
                                            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                              *)local_860,(char (*) [9])"hostname",&local_8d0);
                                  std::__cxx11::string::~string((string *)&local_8d0);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_8f8,"4.5.6",
                                             (allocator *)((long)&gtest_ar_16.message_.ptr_ + 7));
                                  std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                  ::emplace_back<char_const(&)[15],std::__cxx11::string>
                                            ((vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>
                                              *)local_860,(char (*) [15])"my.app.version",&local_8f8
                                            );
                                  std::__cxx11::string::~string((string *)&local_8f8);
                                  std::allocator<char>::~allocator
                                            ((allocator<char> *)
                                             ((long)&gtest_ar_16.message_.ptr_ + 7));
                                  rhs = Config::tags((Config *)local_228);
                                  testing::internal::EqHelper<false>::
                                  Compare<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                                            ((EqHelper<false> *)local_910,"expectedTags",
                                             "config.tags()",
                                             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                              *)local_860,rhs);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_910);
                                  if (!bVar1) {
                                    testing::Message::Message(local_918);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_910);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                               ,0xaa,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_17.message_,local_918);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_);
                                    testing::Message::~Message(local_918);
                                  }
                                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                                  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_910);
                                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                    local_931 = false;
                                    local_932 = Config::disabled((Config *)local_228);
                                    testing::internal::EqHelper<false>::Compare<bool,bool>
                                              ((EqHelper<false> *)local_930,"false",
                                               "config.disabled()",&local_931,&local_932);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_930);
                                    if (!bVar1) {
                                      testing::Message::Message(local_940);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_930);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                                 ,0xac,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_18.message_,local_940);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_);
                                      testing::Message::~Message(local_940);
                                    }
                                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                                    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_930);
                                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                      testutils::EnvVariable::setEnv("JAEGER_DISABLED","TRue");
                                      testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT","445");
                                      jaegertracing::Config::fromEnv();
                                      local_959 = true;
                                      local_95a = Config::disabled((Config *)local_228);
                                      testing::internal::EqHelper<false>::Compare<bool,bool>
                                                ((EqHelper<false> *)local_958,"true",
                                                 "config.disabled()",&local_959,&local_95a);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_958);
                                      if (!bVar1) {
                                        testing::Message::Message(local_968);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_958);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                                  ,0xb2,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_19.message_,local_968);
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_);
                                        testing::Message::~Message(local_968);
                                      }
                                      gtest_ar_1.message_.ptr_._5_3_ = 0;
                                      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_958);
                                      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_9a0,"host33:445",&local_9a1);
                                        pCVar2 = Config::reporter((Config *)local_228);
                                        psVar3 = reporters::Config::localAgentHostPort_abi_cxx11_
                                                           (pCVar2);
                                        testing::internal::EqHelper<false>::
                                        Compare<std::__cxx11::string,std::__cxx11::string>
                                                  ((EqHelper<false> *)local_980,
                                                   "std::string(\"host33:445\")",
                                                   "config.reporter().localAgentHostPort()",
                                                   &local_9a0,psVar3);
                                        std::__cxx11::string::~string((string *)&local_9a0);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_9a1);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_980);
                                        if (!bVar1) {
                                          testing::Message::Message(local_9b0);
                                          pcVar4 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_980);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (local_9b8,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ConfigTest.cpp"
                                                  ,0xb4,pcVar4);
                                          testing::internal::AssertHelper::operator=
                                                    (local_9b8,local_9b0);
                                          testing::internal::AssertHelper::~AssertHelper(local_9b8);
                                          testing::Message::~Message(local_9b0);
                                        }
                                        gtest_ar_1.message_.ptr_._5_3_ = 0;
                                        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_980);
                                        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                                          testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST","");
                                          testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT","");
                                          testutils::EnvVariable::setEnv("JAEGER_ENDPOINT","");
                                          testutils::EnvVariable::setEnv
                                                    ("JAEGER_REPORTER_MAX_QUEUE_SIZE","");
                                          testutils::EnvVariable::setEnv
                                                    ("JAEGER_REPORTER_FLUSH_INTERVAL","");
                                          testutils::EnvVariable::setEnv
                                                    ("JAEGER_REPORTER_LOG_SPANS","");
                                          testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM","");
                                          testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE","");
                                          testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME","");
                                          testutils::EnvVariable::setEnv("JAEGER_TAGS","");
                                          testutils::EnvVariable::setEnv("JAEGER_DISABLED","");
                                          gtest_ar_1.message_.ptr_._4_4_ = 0;
                                        }
                                      }
                                    }
                                  }
                                  std::
                                  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
                                  ~vector((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                                           *)local_860);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  Config::~Config((Config *)local_228);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_28);
  return;
}

Assistant:

TEST(Config, testFromEnv)
{
    std::vector<Tag> tags;
    tags.emplace_back("hostname", std::string("foo"));
    tags.emplace_back("my.app.version", std::string("1.2.3"));

    Config config(false,
                  samplers::Config("probabilistic",
                                   0.7,
                                   "http://host34:57/sampling",
                                   0,
                                   samplers::Config::Clock::duration()),
                  reporters::Config(10,
                                    std::chrono::milliseconds(100),
                                    false,
                                    "host35:77",
                                    "http://host36:56568"),
                  propagation::HeadersConfig(),
                  baggage::RestrictionsConfig(),
                  "test-service",
                  tags);

    config.fromEnv();

    ASSERT_EQ(std::string("http://host36:56568"), config.reporter().endpoint());
    ASSERT_EQ(std::string("host35:77"), config.reporter().localAgentHostPort());

    ASSERT_EQ(10, config.reporter().queueSize());
    ASSERT_EQ(std::chrono::milliseconds(100),
              config.reporter().bufferFlushInterval());
    ASSERT_EQ(false, config.reporter().logSpans());

    ASSERT_EQ(.7, config.sampler().param());
    ASSERT_EQ(std::string("probabilistic"), config.sampler().type());

    testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST", "host33");
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "45");
    testutils::EnvVariable::setEnv("JAEGER_ENDPOINT", "http://host34:56567");

    testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE", "33");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL", "45");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS", "true");

    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE", "remote");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM", "0.33");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLING_ENDPOINT", "http://myagent:1234");

    testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME", "AService");
    testutils::EnvVariable::setEnv("JAEGER_TAGS", "hostname=foobar,my.app.version=4.5.6");

    config.fromEnv();

    ASSERT_EQ(std::string("http://host34:56567"), config.reporter().endpoint());
    ASSERT_EQ(std::string("host33:45"), config.reporter().localAgentHostPort());

    ASSERT_EQ(33, config.reporter().queueSize());
    ASSERT_EQ(std::chrono::milliseconds(45),
              config.reporter().bufferFlushInterval());
    ASSERT_EQ(true, config.reporter().logSpans());

    ASSERT_EQ(std::string("remote"), config.sampler().type());
    ASSERT_EQ(0.33, config.sampler().param());
    ASSERT_EQ(std::string("http://myagent:1234"), config.sampler().samplingServerURL());

    ASSERT_EQ(std::string("AService"), config.serviceName());

    std::vector<Tag> expectedTags;
    expectedTags.emplace_back("hostname", std::string("foo"));
    expectedTags.emplace_back("my.app.version", std::string("1.2.3"));
    expectedTags.emplace_back("hostname", std::string("foobar"));
    expectedTags.emplace_back("my.app.version", std::string("4.5.6"));
    ASSERT_EQ(expectedTags, config.tags());

    ASSERT_EQ(false, config.disabled());

    testutils::EnvVariable::setEnv("JAEGER_DISABLED", "TRue");  // case-insensitive
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "445");

    config.fromEnv();
    ASSERT_EQ(true, config.disabled());
    ASSERT_EQ(std::string("host33:445"),
              config.reporter().localAgentHostPort());

    testutils::EnvVariable::setEnv("JAEGER_AGENT_HOST", "");
    testutils::EnvVariable::setEnv("JAEGER_AGENT_PORT", "");
    testutils::EnvVariable::setEnv("JAEGER_ENDPOINT", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_MAX_QUEUE_SIZE", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_FLUSH_INTERVAL", "");
    testutils::EnvVariable::setEnv("JAEGER_REPORTER_LOG_SPANS", "");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_PARAM", "");
    testutils::EnvVariable::setEnv("JAEGER_SAMPLER_TYPE", "");
    testutils::EnvVariable::setEnv("JAEGER_SERVICE_NAME", "");
    testutils::EnvVariable::setEnv("JAEGER_TAGS", "");
    testutils::EnvVariable::setEnv("JAEGER_DISABLED", "");
}